

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_doing(Curl_easy *data,_Bool *dophase_done)

{
  CURLcode CVar1;
  
  CVar1 = ftp_multi_statemach(data,dophase_done);
  if ((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, *dophase_done == true)) {
    CVar1 = ftp_dophase_done(data,false);
    return CVar1;
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_doing(struct Curl_easy *data,
                          bool *dophase_done)
{
  CURLcode result = ftp_multi_statemach(data, dophase_done);

  if(result)
    DEBUGF(infof(data, "DO phase failed"));
  else if(*dophase_done) {
    result = ftp_dophase_done(data, FALSE /* not connected */);

    DEBUGF(infof(data, "DO phase is complete2"));
  }
  return result;
}